

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExteriorOrientation.cpp
# Opt level: O3

matrix * __thiscall
ExteriorOrientation::get_transformation(matrix *__return_storage_ptr__,ExteriorOrientation *this)

{
  double *pdVar1;
  void *pvVar2;
  long lVar3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_10;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8 [4];
  undefined1 local_d8 [8];
  matrix rotationY;
  matrix rotationX;
  matrix rotationZ;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double local_40;
  double local_38;
  allocator_type local_2c;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  pdVar1 = (this->_rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = pdVar1[1] * -0.017453292519943295;
  local_40 = *pdVar1 * -0.017453292519943295;
  local_38 = pdVar1[2] * -0.017453292519943295;
  rotationY.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)cos(local_48);
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)sin(local_48);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 &rotationY.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &rotationZ.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,(allocator_type *)&local_110);
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_00._M_len = 3;
  __l_00._M_array =
       (iterator)
       &rotationX.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_00,(allocator_type *)local_f8);
  local_128 = sin(local_48);
  local_128 = -local_128;
  local_120 = 0.0;
  local_118 = cos(local_48);
  __l_01._M_len = 3;
  __l_01._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l_01,&local_2a);
  __l_02._M_len = 3;
  __l_02._M_array =
       (iterator)
       &rotationZ.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_d8,__l_02,&local_29);
  lVar3 = 0x30;
  do {
    pvVar2 = *(void **)((long)&rotationZ.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_03._M_len = 3;
  __l_03._M_array =
       (iterator)
       &rotationX.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &rotationZ.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_03,(allocator_type *)local_f8);
  local_128 = 0.0;
  local_120 = cos(local_40);
  local_118 = sin(local_40);
  local_118 = -local_118;
  __l_04._M_len = 3;
  __l_04._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_04,&local_2a);
  local_110 = 0.0;
  local_108 = sin(local_40);
  local_100 = cos(local_40);
  __l_05._M_len = 3;
  __l_05._M_array = &local_110;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l_05,(allocator_type *)&local_29)
  ;
  __l_06._M_len = 3;
  __l_06._M_array =
       (iterator)
       &rotationZ.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&rotationY.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_06,&local_2b);
  lVar3 = 0x30;
  do {
    pvVar2 = *(void **)((long)&rotationZ.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_128 = cos(local_38);
  local_120 = sin(local_38);
  local_120 = -local_120;
  local_118 = 0.0;
  __l_07._M_len = 3;
  __l_07._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &rotationZ.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_07,&local_2a);
  local_110 = sin(local_38);
  local_108 = cos(local_38);
  local_100 = 0.0;
  __l_08._M_len = 3;
  __l_08._M_array = &local_110;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_08,(allocator_type *)&local_29)
  ;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 1.0;
  __l_09._M_len = 3;
  __l_09._M_array = local_f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l_09,(allocator_type *)&local_2b)
  ;
  __l_10._M_len = 3;
  __l_10._M_array =
       (iterator)
       &rotationZ.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&rotationX.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_10,&local_2c);
  lVar3 = 0x30;
  do {
    pvVar2 = *(void **)((long)&rotationZ.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  multiply((matrix *)
           &rotationZ.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,
           (matrix *)
           &rotationY.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,(matrix *)local_d8);
  multiply(__return_storage_ptr__,
           (matrix *)
           &rotationZ.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,
           (matrix *)
           &rotationX.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&rotationZ.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&rotationX.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&rotationY.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

matrix ExteriorOrientation::get_transformation()
{
    const double deg_to_rad = M_PI / 180.0;

    //Rotation direction
    int rotDir = -1;

    //Matrices for rotations around various axes
    const double y = ExteriorOrientation::_rotation[1] * deg_to_rad * rotDir;
    const double x = ExteriorOrientation::_rotation[0] * deg_to_rad * rotDir;
    const double z = ExteriorOrientation::_rotation[2] * deg_to_rad * rotDir;

    /* matlab code/comment:
            rty=[cos(pitch*degtorad_i),0, sin(pitch*degtorad_i);
            0 , 1, 0;
            -sin(pitch*degtorad_i),0,cos(pitch*degtorad_i)];*/



    const matrix rotationY = {{cos(y),  0, sin(y)},
                              {0,       1, 0},
                              {-sin(y), 0, cos(y)}};


    /* matlab code/comment:
    %Rotation x
    rtx=[1,0,0;
    0, cos(roll*degtorad_i),-sin(roll*degtorad_i);
    0, sin(roll*degtorad_i),cos(roll*degtorad_i)];
    %Rotation z
    */

    const matrix rotationX = {{1, 0,      0},
                              {0, cos(x), -sin(x)},
                              {0, sin(x), cos(x)}};

/*  matlab code/comment:
    rtz=[cos(yaw*degtorad_i),-sin(yaw*degtorad_i),0;
            sin(yaw*degtorad_i),cos(yaw*degtorad_i),0;
            0,0,1];

*/
    const matrix rotationZ = {{cos(z), -sin(z), 0},
                              {sin(z), cos(z),  0},
                              {0,      0,       1}};


    //Finally:  RM=rty*rtx*rtz;
    //Implement the above as (y*x)*z, by using the matrix multiplication method... we should consider using a class with the * operator, for convenience
    matrix RM = multiply(multiply(rotationX, rotationY), rotationZ);


    return RM; //Rotation matrix.
}